

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

int r4k_map_address_mips64el
              (CPUMIPSState_conflict5 *env,hwaddr *physical,int *prot,target_ulong address,int rw,
              int access_type)

{
  ushort uVar1;
  uint uVar2;
  CPUMIPSTLBContext_conflict1 *pCVar3;
  bool bVar4;
  int *piVar5;
  undefined1 *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar2 = env->CP0_Config5;
  if ((uVar2 >> 0x11 & 1) == 0) {
    uVar8 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  }
  else {
    uVar8 = env->CP0_MemoryMapID;
  }
  pCVar3 = env->tlb;
  if (pCVar3->tlb_in_use != 0) {
    puVar6 = (undefined1 *)((long)&pCVar3->mmu + 0x18);
    uVar10 = 0;
    piVar5 = prot;
    do {
      if ((uVar2 >> 0x11 & 1) == 0) {
        uVar7 = (uint)*(ushort *)(puVar6 + -0xc);
      }
      else {
        uVar7 = *(uint *)(puVar6 + -8);
      }
      uVar1 = *(ushort *)(puVar6 + -4);
      bVar4 = true;
      if (((((uVar1 & 1) != 0) || (uVar7 == uVar8)) &&
          (uVar12 = (ulong)*(uint *)(puVar6 + -0x10) | 0x1fff,
          ((env->SEGMask & address ^
           (((anon_union_5120_1_ba1d6e09_for_mmu *)(puVar6 + -0x18))->r4k).tlb[0].VPN) & ~uVar12) ==
          0)) && (-1 < (short)uVar1)) {
        uVar11 = (uint)uVar12;
        uVar7 = (uint)(uVar12 >> 1);
        uVar9 = ~uVar7 & (uint)address;
        if ((uVar9 & uVar11) == 0) {
          if (-1 < (char)uVar1) goto LAB_00964d70;
LAB_00964d7f:
          if (rw == 0) {
            if ((uVar9 & uVar11) == 0) {
              if ((uVar1 >> 0xd & 1) != 0) goto LAB_00964e61;
            }
            else if (0x3fff < uVar1) {
LAB_00964e61:
              piVar5 = (int *)0xfffffffb;
              goto LAB_00964e78;
            }
          }
          else if (rw == 1) {
            if ((uVar9 & uVar11) == 0) {
              uVar1 = uVar1 >> 9;
            }
            else {
              uVar1 = uVar1 >> 10;
            }
            if ((uVar1 & 1) == 0) {
              piVar5 = (int *)0xfffffffc;
              goto LAB_00964e78;
            }
          }
          else if (rw == 2) {
            if ((uVar9 & uVar11) == 0) {
              uVar1 = uVar1 >> 0xb;
            }
            else {
              uVar1 = uVar1 >> 0xc;
            }
            if ((uVar1 & 1) != 0) {
              piVar5 = (int *)0xfffffffa;
              goto LAB_00964e78;
            }
          }
          *physical = (ulong)(uVar7 & (uint)address) |
                      *(ulong *)(puVar6 + (ulong)((uVar9 & uVar11) != 0) * 8);
          *prot = 1;
          if ((uVar9 & uVar11) == 0) {
            uVar1 = *(ushort *)(puVar6 + -4) >> 9;
          }
          else {
            uVar1 = *(ushort *)(puVar6 + -4) >> 10;
          }
          if ((uVar1 & 1) != 0) {
            *prot = 3;
          }
          piVar5 = (int *)0x0;
          if ((uVar9 & uVar11) == 0) {
            uVar1 = *(ushort *)(puVar6 + -4) >> 0xb;
          }
          else {
            uVar1 = *(ushort *)(puVar6 + -4) >> 0xc;
          }
          bVar4 = false;
          if ((uVar1 & 1) != 0) goto LAB_00964e7b;
          *(byte *)prot = (byte)*prot | 4;
          piVar5 = (int *)0x0;
        }
        else {
          if ((uVar1 >> 8 & 1) != 0) goto LAB_00964d7f;
LAB_00964d70:
          piVar5 = (int *)0xfffffffd;
        }
LAB_00964e78:
        bVar4 = false;
      }
LAB_00964e7b:
      if (!bVar4) {
        return (int)piVar5;
      }
      uVar10 = uVar10 + 1;
      puVar6 = puVar6 + 0x28;
    } while (uVar10 < pCVar3->tlb_in_use);
  }
  return -2;
}

Assistant:

int r4k_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                    target_ulong address, int rw, int access_type)
{
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;

    for (i = 0; i < env->tlb->tlb_in_use; i++) {
        r4k_tlb_t *tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        target_ulong mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        target_ulong tag = address & ~mask;
        target_ulong VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif

        /* Check ASID/MMID, virtual page number & size */
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            int n = !!(address & mask & ~(mask >> 1));
            /* Check access rights */
            if (!(n ? tlb->V1 : tlb->V0)) {
                return TLBRET_INVALID;
            }
            if (rw == MMU_INST_FETCH && (n ? tlb->XI1 : tlb->XI0)) {
                return TLBRET_XI;
            }
            if (rw == MMU_DATA_LOAD && (n ? tlb->RI1 : tlb->RI0)) {
                return TLBRET_RI;
            }
            if (rw != MMU_DATA_STORE || (n ? tlb->D1 : tlb->D0)) {
                *physical = tlb->PFN[n] | (address & (mask >> 1));
                *prot = PAGE_READ;
                if (n ? tlb->D1 : tlb->D0) {
                    *prot |= PAGE_WRITE;
                }
                if (!(n ? tlb->XI1 : tlb->XI0)) {
                    *prot |= PAGE_EXEC;
                }
                return TLBRET_MATCH;
            }
            return TLBRET_DIRTY;
        }
    }
    return TLBRET_NOMATCH;
}